

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

istream * Json::operator>>(istream *sin,Value *root)

{
  bool bVar1;
  string errs;
  CharReaderBuilder b;
  allocator local_89;
  string local_88;
  string local_68;
  CharReaderBuilder local_48;
  
  CharReaderBuilder::CharReaderBuilder(&local_48);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  bVar1 = parseFromStream(&local_48.super_Factory,sin,root,&local_88);
  if (!bVar1) {
    fprintf(_stderr,"Error from reader: %s",local_88._M_dataplus._M_p);
    std::__cxx11::string::string((string *)&local_68,"reader error",&local_89);
    throwRuntimeError(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_88);
  CharReaderBuilder::~CharReaderBuilder(&local_48);
  return sin;
}

Assistant:

std::istream& operator>>(std::istream& sin, Value& root) {
  CharReaderBuilder b;
  std::string errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            errs.c_str());

    throwRuntimeError("reader error");
  }
  return sin;
}